

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateTime.h
# Opt level: O0

string * __thiscall DateTime::ToString_abi_cxx11_(string *__return_storage_ptr__,DateTime *this)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  int iVar3;
  undefined8 uVar4;
  ostream *poVar5;
  int local_1ac;
  int local_1a8;
  int day;
  int month;
  int year;
  stringstream ss;
  ostream local_190 [376];
  DateTime *local_18;
  DateTime *this_local;
  
  local_18 = this;
  this_local = (DateTime *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)&month);
  FromTicks(this,&day,&local_1a8,&local_1ac);
  uVar4 = std::ostream::operator<<(local_190,std::right);
  _Var1 = std::setfill<char>('0');
  std::operator<<(uVar4,_Var1._M_c);
  _Var2 = std::setw(4);
  poVar5 = std::operator<<(local_190,_Var2);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,day);
  std::operator<<(poVar5,"-");
  _Var2 = std::setw(2);
  poVar5 = std::operator<<(local_190,_Var2);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_1a8);
  std::operator<<(poVar5,"-");
  _Var2 = std::setw(2);
  poVar5 = std::operator<<(local_190,_Var2);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_1ac);
  std::operator<<(poVar5," ");
  _Var2 = std::setw(2);
  poVar5 = std::operator<<(local_190,_Var2);
  iVar3 = Hour(this);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
  std::operator<<(poVar5,":");
  _Var2 = std::setw(2);
  poVar5 = std::operator<<(local_190,_Var2);
  iVar3 = Minute(this);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
  std::operator<<(poVar5,":");
  _Var2 = std::setw(2);
  poVar5 = std::operator<<(local_190,_Var2);
  iVar3 = Second(this);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
  std::operator<<(poVar5,".");
  _Var2 = std::setw(6);
  poVar5 = std::operator<<(local_190,_Var2);
  iVar3 = Microsecond(this);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
  std::operator<<(poVar5," UTC");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&month);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString() const
    {
        std::stringstream ss;
        int year;
        int month;
        int day;
        FromTicks(year, month, day);
        ss << std::right << std::setfill('0');
        ss << std::setw(4) << year << "-";
        ss << std::setw(2) << month << "-";
        ss << std::setw(2) << day << " ";
        ss << std::setw(2) << Hour() << ":";
        ss << std::setw(2) << Minute() << ":";
        ss << std::setw(2) << Second() << ".";
        ss << std::setw(6) << Microsecond() << " UTC";
        return ss.str();
    }